

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O0

int __thiscall
AMinotaur::DoSpecialDamage(AMinotaur *this,AActor *target,int damage,FName *damagetype)

{
  uint uVar1;
  bool bVar2;
  TFlags<ActorFlag,_unsigned_int> local_38;
  FName local_34;
  FName *local_30;
  FName *damagetype_local;
  AActor *pAStack_20;
  int damage_local;
  AActor *target_local;
  AMinotaur *this_local;
  
  local_30 = damagetype;
  damagetype_local._4_4_ = damage;
  pAStack_20 = target;
  target_local = &this->super_AActor;
  FName::FName(&local_34,damagetype);
  damagetype_local._4_4_ = AActor::DoSpecialDamage(&this->super_AActor,target,damage,&local_34);
  bVar2 = false;
  if (damagetype_local._4_4_ != -1) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_38,(int)this + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
    bVar2 = uVar1 != 0;
  }
  if (bVar2) {
    P_MinotaurSlam(&this->super_AActor,pAStack_20);
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = damagetype_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int AMinotaur::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	damage = Super::DoSpecialDamage (target, damage, damagetype);
	if ((damage != -1) && (flags & MF_SKULLFLY))
	{ // Slam only when in charge mode
		P_MinotaurSlam (this, target);
		return -1;
	}
	return damage;
}